

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionState.h
# Opt level: O1

bool __thiscall FIX::SessionState::retrieve(SessionState *this,int msgSeqNum,Message *message)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  const_iterator __position;
  
  Mutex::lock(&this->m_mutex);
  p_Var1 = &(this->m_queue)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->m_queue)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < msgSeqNum])
  {
    if (msgSeqNum <= (int)p_Var3[1]._M_color) {
      p_Var4 = p_Var3;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
     (__position._M_node = p_Var4, msgSeqNum < (int)p_Var4[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    FieldMap::operator=(&message->super_FieldMap,(FieldMap *)&__position._M_node[1]._M_parent);
    FieldMap::operator=(&(message->m_header).super_FieldMap,
                        (FieldMap *)&__position._M_node[4]._M_right);
    FieldMap::operator=(&(message->m_trailer).super_FieldMap,
                        (FieldMap *)&__position._M_node[8]._M_parent);
    *(_Base_ptr *)&message->m_validStructure = __position._M_node[0xb]._M_right;
    std::
    _Rb_tree<int,_std::pair<const_int,_FIX::Message>,_std::_Select1st<std::pair<const_int,_FIX::Message>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::Message>_>_>
    ::_M_erase_aux(&(this->m_queue)._M_t,__position);
  }
  iVar2 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar2 + -1;
  if (iVar2 < 2) {
    (this->m_mutex).m_threadID = 0;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool retrieve( int msgSeqNum, Message& message )
  {
    Locker l( m_mutex );
    Messages::iterator i = m_queue.find( msgSeqNum );
    if ( i != m_queue.end() )
    {
      message = i->second;
      m_queue.erase( i );
      return true;
    }
    return false;
  }